

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

bool benchmark::CpuScalingEnabled(void)

{
  int iVar1;
  char *__filename;
  size_t sVar2;
  size_t bytes_read;
  char buff [16];
  FILE *file;
  string governor_file;
  int num_cpus;
  int cpu;
  char (*in_stack_00000118) [26];
  int *in_stack_00000120;
  char (*in_stack_00000128) [28];
  undefined1 *local_80;
  undefined1 local_58 [11];
  undefined1 auStack_4d [5];
  int local_48;
  FILE *local_38;
  string local_30 [36];
  int local_c;
  int local_8;
  byte local_1;
  
  local_8 = 0;
  local_c = NumCPUs();
  do {
    if (local_c <= local_8) {
LAB_0017e471:
      local_1 = 0;
LAB_0017e479:
      return (bool)(local_1 & 1);
    }
    StrCat<char_const(&)[28],int&,char_const(&)[26]>
              (in_stack_00000128,in_stack_00000120,in_stack_00000118);
    __filename = (char *)std::__cxx11::string::c_str();
    local_38 = fopen(__filename,"r");
    if (local_38 == (FILE *)0x0) {
      local_48 = 2;
    }
    else {
      sVar2 = fread(local_58,1,0x10,local_38);
      fclose(local_38);
      if ((sVar2 < 0xb) || (iVar1 = memcmp(local_58,"performance",0xb), iVar1 != 0)) {
        local_80 = (undefined1 *)0x0;
      }
      else {
        local_80 = auStack_4d;
      }
      if (local_80 == (undefined1 *)0x0) {
        local_1 = 1;
        local_48 = 1;
      }
      else {
        local_48 = 0;
      }
    }
    std::__cxx11::string::~string(local_30);
    if (local_48 != 0) {
      if (local_48 == 1) goto LAB_0017e479;
      goto LAB_0017e471;
    }
    local_8 = local_8 + 1;
  } while( true );
}

Assistant:

bool CpuScalingEnabled() {
#ifndef BENCHMARK_OS_WINDOWS
  // On Linux, the CPUfreq subsystem exposes CPU information as files on the
  // local file system. If reading the exported files fails, then we may not be
  // running on Linux, so we silently ignore all the read errors.
  for (int cpu = 0, num_cpus = NumCPUs(); cpu < num_cpus; ++cpu) {
    std::string governor_file = StrCat("/sys/devices/system/cpu/cpu", cpu,
                                       "/cpufreq/scaling_governor");
    FILE* file = fopen(governor_file.c_str(), "r");
    if (!file) break;
    char buff[16];
    size_t bytes_read = fread(buff, 1, sizeof(buff), file);
    fclose(file);
    if (memprefix(buff, bytes_read, "performance") == nullptr) return true;
  }
#endif
  return false;
}